

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar(void)

{
  undefined4 local_1d8;
  value local_1d4 [2];
  undefined4 local_1cc;
  value local_1c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined4 local_198;
  value local_194 [6];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [11];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = 0x444446755c225b;
  stack0xffffffffffffffef = 0x5d2230;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf7e,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",local_178,
             &local_17c);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_194[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_198 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf80,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",local_194,
             &local_198);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_1c0,(basic_reader<char> *)local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("reader.value<std::string>()","\"\\xEF\\xB7\\x90\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf81,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",&local_1c0,
             anon_var_dwarf_5ef5);
  std::__cxx11::string::~string((string *)&local_1c0);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1c8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1cc = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf83,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",local_1c8,
             &local_1cc);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1d4[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1d8 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf85,"void y_string_suite::y_string_unicode_U_plus_FDD0_nonchar()",local_1d4,
             &local_1d8);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void y_string_unicode_U_plus_FDD0_nonchar()
{
    const char input[] = "[\"\\uFDD0\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xEF\xB7\x90");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}